

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImgList<unsigned_char> * __thiscall
cimg_library::CImgList<unsigned_char>::_load_cimg
          (CImgList<unsigned_char> *this,FILE *file,char *filename)

{
  char cVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  size_t sVar4;
  size_t sVar5;
  CImgArgumentException *pCVar6;
  CImgIOException *pCVar7;
  uint uVar8;
  unsigned_short *ptr;
  long lVar9;
  ulong uVar10;
  bool *pbVar11;
  bool *pbVar12;
  bool *pbVar13;
  char cVar14;
  char cVar15;
  bool *pbVar16;
  char *pcVar17;
  CImg<unsigned_char> *pCVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uchar *puVar22;
  bool bVar23;
  bool bVar24;
  uint C;
  uint D;
  uint H;
  uint W;
  uint N;
  CImg<bool> raw;
  unsigned_long csiz;
  undefined4 local_ac;
  CImg<char> tmp;
  CImg<char> str_pixeltype;
  CImg<char> str_endian;
  
  if (file == (FILE *)0x0 && filename == (char *)0x0) {
    pCVar6 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              (pCVar6,
               "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Specified filename is (null).",
               (ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char");
    __cxa_throw(pCVar6,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  __stream = (FILE *)file;
  if (file == (FILE *)0x0) {
    __stream = cimg::fopen(filename,"rb");
  }
  CImg<char>::CImg(&tmp,0x100,1,1,1);
  CImg<char>::CImg(&str_pixeltype,0x100,1,1,1);
  CImg<char>::CImg(&str_endian,0x100,1,1,1);
  *str_endian._data = '\0';
  *str_pixeltype._data = '\0';
  *tmp._data = '\0';
  N = 0;
  do {
    iVar2 = fgetc(__stream);
    bVar24 = iVar2 >= 0;
    if (iVar2 < 0 || iVar2 == 10) {
      uVar20 = 0;
    }
    else {
      uVar21 = 0;
      do {
        uVar20 = uVar21 + 1;
        tmp._data[uVar21] = (char)iVar2;
        iVar2 = fgetc(__stream);
        bVar24 = -1 < iVar2;
        if ((iVar2 == 10) || (0xfd < uVar21)) break;
        uVar21 = uVar20;
      } while (-1 < iVar2);
    }
    tmp._data[uVar20] = '\0';
  } while ((bVar24) && (*tmp._data == '#'));
  iVar2 = __isoc99_sscanf(tmp._data,"%u%*c%255[A-Za-z_]%*c%255[sA-Za-z_ ]",&N,str_pixeltype._data,
                          str_endian._data);
  if (iVar2 < 2) {
    if (file == (FILE *)0x0) {
      cimg::fclose(__stream);
    }
    pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar17 = "(FILE*)";
    if (filename != (char *)0x0) {
      pcVar17 = filename;
    }
    CImgIOException::CImgIOException
              (pCVar7,
               "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): CImg header not found in file \'%s\'."
               ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char",
               pcVar17);
    goto LAB_0013ea83;
  }
  lVar9 = 0;
  do {
    cVar1 = "little"[lVar9];
    cVar14 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar14 = cVar1;
    }
    cVar1 = str_endian._data[lVar9];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar14 != cVar15) goto LAB_0013abd7;
    lVar9 = lVar9 + 1;
  } while ((int)lVar9 != 6);
  lVar9 = 6;
LAB_0013abd7:
  if (cVar14 == cVar15 || (int)lVar9 == 6) {
    local_ac = 0;
  }
  else {
    lVar9 = 0;
    do {
      cVar1 = "big"[lVar9];
      cVar14 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar14 = cVar1;
      }
      cVar1 = str_endian._data[lVar9];
      cVar15 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar15 = cVar1;
      }
      if (cVar14 != cVar15) goto LAB_0013ac3b;
      lVar9 = lVar9 + 1;
    } while ((int)lVar9 != 3);
    lVar9 = 3;
LAB_0013ac3b:
    local_ac = (undefined4)CONCAT71((int7)((ulong)lVar9 >> 8),cVar14 == cVar15 || (int)lVar9 == 3);
  }
  assign(this,N);
  pcVar17 = str_pixeltype._data;
  sVar4 = strlen(str_pixeltype._data);
  iVar3 = (int)sVar4;
  iVar2 = 4;
  if (iVar3 < 4) {
    iVar2 = iVar3;
  }
  uVar8 = iVar2 + 1;
  if (uVar8 == 0) {
LAB_0013ac83:
    bVar24 = true;
    if (N != 0) {
      uVar20 = 0;
      do {
        iVar2 = fgetc(__stream);
        if (iVar2 < 0 || iVar2 == 10) {
          uVar21 = 0;
        }
        else {
          uVar10 = 0;
          do {
            uVar21 = uVar10 + 1;
            tmp._data[uVar10] = (char)iVar2;
            iVar2 = fgetc(__stream);
            if ((iVar2 == 10) || (iVar2 < 0)) break;
            bVar23 = uVar10 < 0xfe;
            uVar10 = uVar21;
          } while (bVar23);
        }
        tmp._data[uVar21] = '\0';
        C = 0;
        D = 0;
        H = 0;
        W = 0;
        csiz = 0;
        iVar2 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
        if (iVar2 < 4) {
          pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar17 = "(FILE*)";
          if (filename != (char *)0x0) {
            pcVar17 = filename;
          }
          CImgIOException::CImgIOException
                    (pCVar7,
                     "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                     ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char",
                     (ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar20,pcVar17);
          __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
        }
        if (D * C * H * W != 0) {
          raw._data = (bool *)0x0;
          raw._width = 0;
          raw._height = 0;
          raw._depth = 0;
          raw._spectrum = 0;
          raw._is_shared = false;
          if (iVar2 == 5) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            pcVar17 = "(FILE*)";
            if (filename != (char *)0x0) {
              pcVar17 = filename;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                       ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                       "unsigned char",pcVar17);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
          }
          pCVar18 = this->_data + uVar20;
          CImg<unsigned_char>::assign(pCVar18,W,H,D,C);
          uVar21 = (ulong)pCVar18->_spectrum * (ulong)pCVar18->_depth *
                   (ulong)pCVar18->_height * (ulong)pCVar18->_width;
          if (uVar21 != 0) {
            puVar22 = pCVar18->_data;
            do {
              uVar10 = 0x1800000;
              if (uVar21 < 0x1800000) {
                uVar10 = uVar21;
              }
              CImg<bool>::assign(&raw,(uint)uVar10,1,1,1);
              pbVar11 = raw._data;
              uVar8 = raw._width;
              uVar10 = raw._0_8_ & 0xffffffff;
              if ((__stream == (FILE *)0x0) || (raw._data == (bool *)0x0)) {
                pCVar6 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                pcVar17 = "";
                if (1 < uVar8) {
                  pcVar17 = "s";
                }
                CImgArgumentException::CImgArgumentException
                          (pCVar6,
                           "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                           ,uVar10,"bool",pcVar17,__stream,pbVar11);
                __cxa_throw(pCVar6,&CImgArgumentException::typeinfo,CImgException::~CImgException);
              }
              if (uVar10 != 0) {
                lVar9 = 0;
                uVar19 = uVar10;
                do {
                  sVar4 = 0x3f00000;
                  if (uVar19 < 0x3f00000) {
                    sVar4 = uVar19;
                  }
                  sVar5 = fread(pbVar11 + lVar9,1,sVar4,__stream);
                  lVar9 = lVar9 + sVar5;
                  uVar19 = uVar19 - sVar5;
                } while ((sVar4 == sVar5) && (uVar19 != 0));
                if (uVar19 != 0) {
                  cimg::warn("cimg::fread(): Only %u/%u elements could be read from file.",lVar9,
                             uVar10);
                }
              }
              if ((raw._0_8_ & 0xffffffff) != 0) {
                uVar10 = 0;
                do {
                  puVar22[uVar10] = raw._data[uVar10];
                  uVar10 = uVar10 + 1;
                } while ((raw._0_8_ & 0xffffffff) != uVar10);
                puVar22 = puVar22 + uVar10;
              }
              uVar21 = uVar21 - (raw._0_8_ & 0xffffffff);
            } while (uVar21 != 0);
          }
          if ((raw._is_shared == false) && (raw._data != (bool *)0x0)) {
            operator_delete__(raw._data);
          }
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < N);
    }
  }
  else {
    if (iVar3 < 0) {
      bVar24 = true;
      uVar20 = 0;
    }
    else {
      iVar2 = 4;
      if (iVar3 < 4) {
        iVar2 = iVar3;
      }
      uVar20 = 0;
      do {
        cVar1 = "bool"[uVar20];
        cVar14 = cVar1 + ' ';
        if ((byte)(cVar1 + 0xa5U) < 0xe6) {
          cVar14 = cVar1;
        }
        cVar1 = pcVar17[uVar20];
        cVar15 = cVar1 + ' ';
        if ((byte)(cVar1 + 0xa5U) < 0xe6) {
          cVar15 = cVar1;
        }
        bVar24 = cVar14 == cVar15;
        if (!bVar24) goto LAB_0013af5d;
        uVar20 = uVar20 + 1;
      } while (iVar2 + 1 != (int)uVar20);
      uVar20 = (ulong)uVar8;
    }
LAB_0013af5d:
    if (((uint)uVar20 == uVar8) || (bVar24)) goto LAB_0013ac83;
    bVar24 = false;
  }
  pcVar17 = str_pixeltype._data;
  if (!bVar24) {
    sVar4 = strlen(str_pixeltype._data);
    iVar3 = (int)sVar4;
    iVar2 = 0xd;
    if (iVar3 < 0xd) {
      iVar2 = iVar3;
    }
    uVar8 = iVar2 + 1;
    if (uVar8 != 0) {
      if (iVar3 < 0) {
        bVar23 = true;
        uVar20 = 0;
      }
      else {
        iVar2 = 0xd;
        if (iVar3 < 0xd) {
          iVar2 = iVar3;
        }
        uVar20 = 0;
        do {
          cVar1 = "unsigned_char"[uVar20];
          cVar14 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar14 = cVar1;
          }
          cVar1 = pcVar17[uVar20];
          cVar15 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar15 = cVar1;
          }
          bVar23 = cVar14 == cVar15;
          if (!bVar23) goto LAB_0013b27b;
          uVar20 = uVar20 + 1;
        } while (iVar2 + 1 != (int)uVar20);
        uVar20 = (ulong)uVar8;
      }
LAB_0013b27b:
      if (((uint)uVar20 != uVar8) && (!bVar23)) goto LAB_0013b28c;
    }
    bVar24 = true;
    if (N != 0) {
      uVar20 = 0;
      do {
        iVar2 = fgetc(__stream);
        if (iVar2 < 0 || iVar2 == 10) {
          uVar21 = 0;
        }
        else {
          uVar10 = 0;
          do {
            uVar21 = uVar10 + 1;
            tmp._data[uVar10] = (char)iVar2;
            iVar2 = fgetc(__stream);
            if ((iVar2 == 10) || (iVar2 < 0)) break;
            bVar23 = uVar10 < 0xfe;
            uVar10 = uVar21;
          } while (bVar23);
        }
        tmp._data[uVar21] = '\0';
        C = 0;
        D = 0;
        H = 0;
        W = 0;
        csiz = 0;
        iVar2 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
        if (iVar2 < 4) {
          pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar17 = "(FILE*)";
          if (filename != (char *)0x0) {
            pcVar17 = filename;
          }
          CImgIOException::CImgIOException
                    (pCVar7,
                     "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                     ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char",
                     (ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar20,pcVar17);
          __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
        }
        if (D * C * H * W != 0) {
          raw._data = (bool *)0x0;
          raw._width = 0;
          raw._height = 0;
          raw._depth = 0;
          raw._spectrum = 0;
          raw._is_shared = false;
          if (iVar2 == 5) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            pcVar17 = "(FILE*)";
            if (filename != (char *)0x0) {
              pcVar17 = filename;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                       ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                       "unsigned char",pcVar17);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
          }
          pCVar18 = this->_data + uVar20;
          CImg<unsigned_char>::assign(pCVar18,W,H,D,C);
          uVar21 = (ulong)pCVar18->_spectrum * (ulong)pCVar18->_depth *
                   (ulong)pCVar18->_height * (ulong)pCVar18->_width;
          if (uVar21 != 0) {
            puVar22 = pCVar18->_data;
            do {
              uVar10 = 0x1800000;
              if (uVar21 < 0x1800000) {
                uVar10 = uVar21;
              }
              CImg<unsigned_char>::assign((CImg<unsigned_char> *)&raw,(uint)uVar10,1,1,1);
              pbVar11 = raw._data;
              uVar8 = raw._width;
              uVar10 = raw._0_8_ & 0xffffffff;
              if ((__stream == (FILE *)0x0) || (raw._data == (bool *)0x0)) {
                pCVar6 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                pcVar17 = "";
                if (1 < uVar8) {
                  pcVar17 = "s";
                }
                CImgArgumentException::CImgArgumentException
                          (pCVar6,
                           "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                           ,uVar10,"unsigned char",pcVar17,__stream,pbVar11);
                __cxa_throw(pCVar6,&CImgArgumentException::typeinfo,CImgException::~CImgException);
              }
              if (uVar10 != 0) {
                lVar9 = 0;
                uVar19 = uVar10;
                do {
                  sVar4 = 0x3f00000;
                  if (uVar19 < 0x3f00000) {
                    sVar4 = uVar19;
                  }
                  sVar5 = fread(pbVar11 + lVar9,1,sVar4,__stream);
                  lVar9 = lVar9 + sVar5;
                  uVar19 = uVar19 - sVar5;
                } while ((sVar4 == sVar5) && (uVar19 != 0));
                if (uVar19 != 0) {
                  cimg::warn("cimg::fread(): Only %u/%u elements could be read from file.",lVar9,
                             uVar10);
                }
              }
              if ((raw._0_8_ & 0xffffffff) != 0) {
                uVar10 = 0;
                do {
                  puVar22[uVar10] = raw._data[uVar10];
                  uVar10 = uVar10 + 1;
                } while ((raw._0_8_ & 0xffffffff) != uVar10);
                puVar22 = puVar22 + uVar10;
              }
              uVar21 = uVar21 - (raw._0_8_ & 0xffffffff);
            } while (uVar21 != 0);
          }
          if ((raw._is_shared == false) && (raw._data != (bool *)0x0)) {
            operator_delete__(raw._data);
          }
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < N);
    }
  }
LAB_0013b28c:
  pcVar17 = str_pixeltype._data;
  if (!bVar24) {
    sVar4 = strlen(str_pixeltype._data);
    iVar3 = (int)sVar4;
    iVar2 = 5;
    if (iVar3 < 5) {
      iVar2 = iVar3;
    }
    uVar8 = iVar2 + 1;
    if (uVar8 != 0) {
      if (iVar3 < 0) {
        bVar23 = true;
        uVar20 = 0;
      }
      else {
        iVar2 = 5;
        if (iVar3 < 5) {
          iVar2 = iVar3;
        }
        uVar20 = 0;
        do {
          cVar1 = "uchar"[uVar20];
          cVar14 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar14 = cVar1;
          }
          cVar1 = pcVar17[uVar20];
          cVar15 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar15 = cVar1;
          }
          bVar23 = cVar14 == cVar15;
          if (!bVar23) goto LAB_0013b591;
          uVar20 = uVar20 + 1;
        } while (iVar2 + 1 != (int)uVar20);
        uVar20 = (ulong)uVar8;
      }
LAB_0013b591:
      if (((uint)uVar20 != uVar8) && (!bVar23)) goto LAB_0013b5a2;
    }
    bVar24 = true;
    if (N != 0) {
      uVar20 = 0;
      do {
        iVar2 = fgetc(__stream);
        if (iVar2 < 0 || iVar2 == 10) {
          uVar21 = 0;
        }
        else {
          uVar10 = 0;
          do {
            uVar21 = uVar10 + 1;
            tmp._data[uVar10] = (char)iVar2;
            iVar2 = fgetc(__stream);
            if ((iVar2 == 10) || (iVar2 < 0)) break;
            bVar23 = uVar10 < 0xfe;
            uVar10 = uVar21;
          } while (bVar23);
        }
        tmp._data[uVar21] = '\0';
        C = 0;
        D = 0;
        H = 0;
        W = 0;
        csiz = 0;
        iVar2 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
        if (iVar2 < 4) {
          pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar17 = "(FILE*)";
          if (filename != (char *)0x0) {
            pcVar17 = filename;
          }
          CImgIOException::CImgIOException
                    (pCVar7,
                     "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                     ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char",
                     (ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar20,pcVar17);
          __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
        }
        if (D * C * H * W != 0) {
          raw._data = (bool *)0x0;
          raw._width = 0;
          raw._height = 0;
          raw._depth = 0;
          raw._spectrum = 0;
          raw._is_shared = false;
          if (iVar2 == 5) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            pcVar17 = "(FILE*)";
            if (filename != (char *)0x0) {
              pcVar17 = filename;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                       ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                       "unsigned char",pcVar17);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
          }
          pCVar18 = this->_data + uVar20;
          CImg<unsigned_char>::assign(pCVar18,W,H,D,C);
          uVar21 = (ulong)pCVar18->_spectrum * (ulong)pCVar18->_depth *
                   (ulong)pCVar18->_height * (ulong)pCVar18->_width;
          if (uVar21 != 0) {
            puVar22 = pCVar18->_data;
            do {
              uVar10 = 0x1800000;
              if (uVar21 < 0x1800000) {
                uVar10 = uVar21;
              }
              CImg<unsigned_char>::assign((CImg<unsigned_char> *)&raw,(uint)uVar10,1,1,1);
              pbVar11 = raw._data;
              uVar8 = raw._width;
              uVar10 = raw._0_8_ & 0xffffffff;
              if ((__stream == (FILE *)0x0) || (raw._data == (bool *)0x0)) {
                pCVar6 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                pcVar17 = "";
                if (1 < uVar8) {
                  pcVar17 = "s";
                }
                CImgArgumentException::CImgArgumentException
                          (pCVar6,
                           "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                           ,uVar10,"unsigned char",pcVar17,__stream,pbVar11);
                __cxa_throw(pCVar6,&CImgArgumentException::typeinfo,CImgException::~CImgException);
              }
              if (uVar10 != 0) {
                lVar9 = 0;
                uVar19 = uVar10;
                do {
                  sVar4 = 0x3f00000;
                  if (uVar19 < 0x3f00000) {
                    sVar4 = uVar19;
                  }
                  sVar5 = fread(pbVar11 + lVar9,1,sVar4,__stream);
                  lVar9 = lVar9 + sVar5;
                  uVar19 = uVar19 - sVar5;
                } while ((sVar4 == sVar5) && (uVar19 != 0));
                if (uVar19 != 0) {
                  cimg::warn("cimg::fread(): Only %u/%u elements could be read from file.",lVar9,
                             uVar10);
                }
              }
              if ((raw._0_8_ & 0xffffffff) != 0) {
                uVar10 = 0;
                do {
                  puVar22[uVar10] = raw._data[uVar10];
                  uVar10 = uVar10 + 1;
                } while ((raw._0_8_ & 0xffffffff) != uVar10);
                puVar22 = puVar22 + uVar10;
              }
              uVar21 = uVar21 - (raw._0_8_ & 0xffffffff);
            } while (uVar21 != 0);
          }
          if ((raw._is_shared == false) && (raw._data != (bool *)0x0)) {
            operator_delete__(raw._data);
          }
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < N);
    }
  }
LAB_0013b5a2:
  pcVar17 = str_pixeltype._data;
  if (!bVar24) {
    sVar4 = strlen(str_pixeltype._data);
    iVar3 = (int)sVar4;
    iVar2 = 4;
    if (iVar3 < 4) {
      iVar2 = iVar3;
    }
    uVar8 = iVar2 + 1;
    if (uVar8 != 0) {
      if (iVar3 < 0) {
        bVar23 = true;
        uVar20 = 0;
      }
      else {
        iVar2 = 4;
        if (iVar3 < 4) {
          iVar2 = iVar3;
        }
        uVar20 = 0;
        do {
          cVar1 = "unsigned char"[uVar20 + 9];
          cVar14 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar14 = cVar1;
          }
          cVar1 = pcVar17[uVar20];
          cVar15 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar15 = cVar1;
          }
          bVar23 = cVar14 == cVar15;
          if (!bVar23) goto LAB_0013b8a7;
          uVar20 = uVar20 + 1;
        } while (iVar2 + 1 != (int)uVar20);
        uVar20 = (ulong)uVar8;
      }
LAB_0013b8a7:
      if (((uint)uVar20 != uVar8) && (!bVar23)) goto LAB_0013b8b8;
    }
    bVar24 = true;
    if (N != 0) {
      uVar20 = 0;
      do {
        iVar2 = fgetc(__stream);
        if (iVar2 < 0 || iVar2 == 10) {
          uVar21 = 0;
        }
        else {
          uVar10 = 0;
          do {
            uVar21 = uVar10 + 1;
            tmp._data[uVar10] = (char)iVar2;
            iVar2 = fgetc(__stream);
            if ((iVar2 == 10) || (iVar2 < 0)) break;
            bVar23 = uVar10 < 0xfe;
            uVar10 = uVar21;
          } while (bVar23);
        }
        tmp._data[uVar21] = '\0';
        C = 0;
        D = 0;
        H = 0;
        W = 0;
        csiz = 0;
        iVar2 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
        if (iVar2 < 4) {
          pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar17 = "(FILE*)";
          if (filename != (char *)0x0) {
            pcVar17 = filename;
          }
          CImgIOException::CImgIOException
                    (pCVar7,
                     "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                     ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char",
                     (ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar20,pcVar17);
          __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
        }
        if (D * C * H * W != 0) {
          raw._data = (bool *)0x0;
          raw._width = 0;
          raw._height = 0;
          raw._depth = 0;
          raw._spectrum = 0;
          raw._is_shared = false;
          if (iVar2 == 5) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            pcVar17 = "(FILE*)";
            if (filename != (char *)0x0) {
              pcVar17 = filename;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                       ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                       "unsigned char",pcVar17);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
          }
          pCVar18 = this->_data + uVar20;
          CImg<unsigned_char>::assign(pCVar18,W,H,D,C);
          uVar21 = (ulong)pCVar18->_spectrum * (ulong)pCVar18->_depth *
                   (ulong)pCVar18->_height * (ulong)pCVar18->_width;
          if (uVar21 != 0) {
            puVar22 = pCVar18->_data;
            do {
              uVar10 = 0x1800000;
              if (uVar21 < 0x1800000) {
                uVar10 = uVar21;
              }
              CImg<char>::assign((CImg<char> *)&raw,(uint)uVar10,1,1,1);
              pbVar11 = raw._data;
              uVar8 = raw._width;
              uVar10 = raw._0_8_ & 0xffffffff;
              if ((__stream == (FILE *)0x0) || (raw._data == (bool *)0x0)) {
                pCVar6 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                pcVar17 = "";
                if (1 < uVar8) {
                  pcVar17 = "s";
                }
                CImgArgumentException::CImgArgumentException
                          (pCVar6,
                           "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                           ,uVar10,"char",pcVar17,__stream,pbVar11);
                __cxa_throw(pCVar6,&CImgArgumentException::typeinfo,CImgException::~CImgException);
              }
              if (uVar10 != 0) {
                lVar9 = 0;
                uVar19 = uVar10;
                do {
                  sVar4 = 0x3f00000;
                  if (uVar19 < 0x3f00000) {
                    sVar4 = uVar19;
                  }
                  sVar5 = fread(pbVar11 + lVar9,1,sVar4,__stream);
                  lVar9 = lVar9 + sVar5;
                  uVar19 = uVar19 - sVar5;
                } while ((sVar4 == sVar5) && (uVar19 != 0));
                if (uVar19 != 0) {
                  cimg::warn("cimg::fread(): Only %u/%u elements could be read from file.",lVar9,
                             uVar10);
                }
              }
              if ((raw._0_8_ & 0xffffffff) != 0) {
                uVar10 = 0;
                do {
                  puVar22[uVar10] = raw._data[uVar10];
                  uVar10 = uVar10 + 1;
                } while ((raw._0_8_ & 0xffffffff) != uVar10);
                puVar22 = puVar22 + uVar10;
              }
              uVar21 = uVar21 - (raw._0_8_ & 0xffffffff);
            } while (uVar21 != 0);
          }
          if ((raw._is_shared == false) && (raw._data != (bool *)0x0)) {
            operator_delete__(raw._data);
          }
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < N);
    }
  }
LAB_0013b8b8:
  pcVar17 = str_pixeltype._data;
  if (!bVar24) {
    sVar4 = strlen(str_pixeltype._data);
    iVar3 = (int)sVar4;
    iVar2 = 0xe;
    if (iVar3 < 0xe) {
      iVar2 = iVar3;
    }
    uVar8 = iVar2 + 1;
    if (uVar8 != 0) {
      if (iVar3 < 0) {
        bVar23 = true;
        uVar20 = 0;
      }
      else {
        iVar2 = 0xe;
        if (iVar3 < 0xe) {
          iVar2 = iVar3;
        }
        uVar20 = 0;
        do {
          cVar1 = "unsigned_short"[uVar20];
          cVar14 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar14 = cVar1;
          }
          cVar1 = pcVar17[uVar20];
          cVar15 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar15 = cVar1;
          }
          bVar23 = cVar14 == cVar15;
          if (!bVar23) goto LAB_0013bb8a;
          uVar20 = uVar20 + 1;
        } while (iVar2 + 1 != (int)uVar20);
        uVar20 = (ulong)uVar8;
      }
LAB_0013bb8a:
      if (((uint)uVar20 != uVar8) && (!bVar23)) goto LAB_0013bb9b;
    }
    bVar24 = true;
    if (N != 0) {
      uVar20 = 0;
      do {
        iVar2 = fgetc(__stream);
        if (iVar2 < 0 || iVar2 == 10) {
          uVar21 = 0;
        }
        else {
          uVar10 = 0;
          do {
            uVar21 = uVar10 + 1;
            tmp._data[uVar10] = (char)iVar2;
            iVar2 = fgetc(__stream);
            if ((iVar2 == 10) || (iVar2 < 0)) break;
            bVar23 = uVar10 < 0xfe;
            uVar10 = uVar21;
          } while (bVar23);
        }
        tmp._data[uVar21] = '\0';
        C = 0;
        D = 0;
        H = 0;
        W = 0;
        csiz = 0;
        iVar2 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
        if (iVar2 < 4) {
          pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar17 = "(FILE*)";
          if (filename != (char *)0x0) {
            pcVar17 = filename;
          }
          CImgIOException::CImgIOException
                    (pCVar7,
                     "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                     ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char",
                     (ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar20,pcVar17);
          __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
        }
        if (D * C * H * W != 0) {
          raw._data = (bool *)0x0;
          raw._width = 0;
          raw._height = 0;
          raw._depth = 0;
          raw._spectrum = 0;
          raw._is_shared = false;
          if (iVar2 == 5) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            pcVar17 = "(FILE*)";
            if (filename != (char *)0x0) {
              pcVar17 = filename;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                       ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                       "unsigned char",pcVar17);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
          }
          pCVar18 = this->_data + uVar20;
          CImg<unsigned_char>::assign(pCVar18,W,H,D,C);
          uVar21 = (ulong)pCVar18->_spectrum * (ulong)pCVar18->_depth *
                   (ulong)pCVar18->_height * (ulong)pCVar18->_width;
          if (uVar21 != 0) {
            puVar22 = pCVar18->_data;
            do {
              uVar10 = 0x1800000;
              if (uVar21 < 0x1800000) {
                uVar10 = uVar21;
              }
              CImg<unsigned_short>::assign((CImg<unsigned_short> *)&raw,(uint)uVar10,1,1,1);
              cimg::fread<unsigned_short>
                        ((unsigned_short *)raw._data,raw._0_8_ & 0xffffffff,(FILE *)__stream);
              if (((char)local_ac != '\0') &&
                 (lVar9 = ((ulong)raw._8_8_ >> 0x20) * (raw._8_8_ & 0xffffffff) *
                          ((ulong)raw._0_8_ >> 0x20) * (raw._0_8_ & 0xffffffff), 0 < lVar9)) {
                pbVar11 = raw._data + lVar9 * 2;
                do {
                  pbVar12 = pbVar11 + -2;
                  *(ushort *)pbVar12 = *(ushort *)pbVar12 << 8 | *(ushort *)pbVar12 >> 8;
                  pbVar11 = pbVar11 + -2;
                } while (raw._data < pbVar11);
              }
              if ((raw._0_8_ & 0xffffffff) != 0) {
                uVar10 = 0;
                do {
                  puVar22[uVar10] = raw._data[uVar10 * 2];
                  uVar10 = uVar10 + 1;
                } while ((raw._0_8_ & 0xffffffff) != uVar10);
                puVar22 = puVar22 + uVar10;
              }
              uVar21 = uVar21 - (raw._0_8_ & 0xffffffff);
            } while (uVar21 != 0);
          }
          if ((raw._is_shared == false) && (raw._data != (bool *)0x0)) {
            operator_delete__(raw._data);
          }
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < N);
    }
  }
LAB_0013bb9b:
  pcVar17 = str_pixeltype._data;
  if (!bVar24) {
    sVar4 = strlen(str_pixeltype._data);
    iVar3 = (int)sVar4;
    iVar2 = 6;
    if (iVar3 < 6) {
      iVar2 = iVar3;
    }
    uVar8 = iVar2 + 1;
    if (uVar8 != 0) {
      if (iVar3 < 0) {
        bVar23 = true;
        uVar20 = 0;
      }
      else {
        iVar2 = 6;
        if (iVar3 < 6) {
          iVar2 = iVar3;
        }
        uVar20 = 0;
        do {
          cVar1 = "ushort"[uVar20];
          cVar14 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar14 = cVar1;
          }
          cVar1 = pcVar17[uVar20];
          cVar15 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar15 = cVar1;
          }
          bVar23 = cVar14 == cVar15;
          if (!bVar23) goto LAB_0013be6d;
          uVar20 = uVar20 + 1;
        } while (iVar2 + 1 != (int)uVar20);
        uVar20 = (ulong)uVar8;
      }
LAB_0013be6d:
      if (((uint)uVar20 != uVar8) && (!bVar23)) goto LAB_0013be7e;
    }
    bVar24 = true;
    if (N != 0) {
      uVar20 = 0;
      do {
        iVar2 = fgetc(__stream);
        if (iVar2 < 0 || iVar2 == 10) {
          uVar21 = 0;
        }
        else {
          uVar10 = 0;
          do {
            uVar21 = uVar10 + 1;
            tmp._data[uVar10] = (char)iVar2;
            iVar2 = fgetc(__stream);
            if ((iVar2 == 10) || (iVar2 < 0)) break;
            bVar23 = uVar10 < 0xfe;
            uVar10 = uVar21;
          } while (bVar23);
        }
        tmp._data[uVar21] = '\0';
        C = 0;
        D = 0;
        H = 0;
        W = 0;
        csiz = 0;
        iVar2 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
        if (iVar2 < 4) {
          pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar17 = "(FILE*)";
          if (filename != (char *)0x0) {
            pcVar17 = filename;
          }
          CImgIOException::CImgIOException
                    (pCVar7,
                     "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                     ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char",
                     (ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar20,pcVar17);
          __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
        }
        if (D * C * H * W != 0) {
          raw._data = (bool *)0x0;
          raw._width = 0;
          raw._height = 0;
          raw._depth = 0;
          raw._spectrum = 0;
          raw._is_shared = false;
          if (iVar2 == 5) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            pcVar17 = "(FILE*)";
            if (filename != (char *)0x0) {
              pcVar17 = filename;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                       ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                       "unsigned char",pcVar17);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
          }
          pCVar18 = this->_data + uVar20;
          CImg<unsigned_char>::assign(pCVar18,W,H,D,C);
          uVar21 = (ulong)pCVar18->_spectrum * (ulong)pCVar18->_depth *
                   (ulong)pCVar18->_height * (ulong)pCVar18->_width;
          if (uVar21 != 0) {
            puVar22 = pCVar18->_data;
            do {
              uVar10 = 0x1800000;
              if (uVar21 < 0x1800000) {
                uVar10 = uVar21;
              }
              CImg<unsigned_short>::assign((CImg<unsigned_short> *)&raw,(uint)uVar10,1,1,1);
              cimg::fread<unsigned_short>
                        ((unsigned_short *)raw._data,raw._0_8_ & 0xffffffff,(FILE *)__stream);
              if (((char)local_ac != '\0') &&
                 (lVar9 = ((ulong)raw._8_8_ >> 0x20) * (raw._8_8_ & 0xffffffff) *
                          ((ulong)raw._0_8_ >> 0x20) * (raw._0_8_ & 0xffffffff), 0 < lVar9)) {
                pbVar11 = raw._data + lVar9 * 2;
                do {
                  pbVar12 = pbVar11 + -2;
                  *(ushort *)pbVar12 = *(ushort *)pbVar12 << 8 | *(ushort *)pbVar12 >> 8;
                  pbVar11 = pbVar11 + -2;
                } while (raw._data < pbVar11);
              }
              if ((raw._0_8_ & 0xffffffff) != 0) {
                uVar10 = 0;
                do {
                  puVar22[uVar10] = raw._data[uVar10 * 2];
                  uVar10 = uVar10 + 1;
                } while ((raw._0_8_ & 0xffffffff) != uVar10);
                puVar22 = puVar22 + uVar10;
              }
              uVar21 = uVar21 - (raw._0_8_ & 0xffffffff);
            } while (uVar21 != 0);
          }
          if ((raw._is_shared == false) && (raw._data != (bool *)0x0)) {
            operator_delete__(raw._data);
          }
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < N);
    }
  }
LAB_0013be7e:
  pcVar17 = str_pixeltype._data;
  if (!bVar24) {
    sVar4 = strlen(str_pixeltype._data);
    iVar3 = (int)sVar4;
    iVar2 = 5;
    if (iVar3 < 5) {
      iVar2 = iVar3;
    }
    uVar8 = iVar2 + 1;
    if (uVar8 != 0) {
      if (iVar3 < 0) {
        bVar23 = true;
        uVar20 = 0;
      }
      else {
        iVar2 = 5;
        if (iVar3 < 5) {
          iVar2 = iVar3;
        }
        uVar20 = 0;
        do {
          cVar1 = "unsigned short"[uVar20 + 9];
          cVar14 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar14 = cVar1;
          }
          cVar1 = pcVar17[uVar20];
          cVar15 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar15 = cVar1;
          }
          bVar23 = cVar14 == cVar15;
          if (!bVar23) goto LAB_0013c150;
          uVar20 = uVar20 + 1;
        } while (iVar2 + 1 != (int)uVar20);
        uVar20 = (ulong)uVar8;
      }
LAB_0013c150:
      if (((uint)uVar20 != uVar8) && (!bVar23)) goto LAB_0013c161;
    }
    bVar24 = true;
    if (N != 0) {
      uVar20 = 0;
      do {
        iVar2 = fgetc(__stream);
        if (iVar2 < 0 || iVar2 == 10) {
          uVar21 = 0;
        }
        else {
          uVar10 = 0;
          do {
            uVar21 = uVar10 + 1;
            tmp._data[uVar10] = (char)iVar2;
            iVar2 = fgetc(__stream);
            if ((iVar2 == 10) || (iVar2 < 0)) break;
            bVar23 = uVar10 < 0xfe;
            uVar10 = uVar21;
          } while (bVar23);
        }
        tmp._data[uVar21] = '\0';
        C = 0;
        D = 0;
        H = 0;
        W = 0;
        csiz = 0;
        iVar2 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
        if (iVar2 < 4) {
          pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar17 = "(FILE*)";
          if (filename != (char *)0x0) {
            pcVar17 = filename;
          }
          CImgIOException::CImgIOException
                    (pCVar7,
                     "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                     ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char",
                     (ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar20,pcVar17);
          __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
        }
        if (D * C * H * W != 0) {
          raw._data = (bool *)0x0;
          raw._width = 0;
          raw._height = 0;
          raw._depth = 0;
          raw._spectrum = 0;
          raw._is_shared = false;
          if (iVar2 == 5) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            pcVar17 = "(FILE*)";
            if (filename != (char *)0x0) {
              pcVar17 = filename;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                       ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                       "unsigned char",pcVar17);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
          }
          pCVar18 = this->_data + uVar20;
          CImg<unsigned_char>::assign(pCVar18,W,H,D,C);
          uVar21 = (ulong)pCVar18->_spectrum * (ulong)pCVar18->_depth *
                   (ulong)pCVar18->_height * (ulong)pCVar18->_width;
          if (uVar21 != 0) {
            puVar22 = pCVar18->_data;
            do {
              uVar10 = 0x1800000;
              if (uVar21 < 0x1800000) {
                uVar10 = uVar21;
              }
              CImg<short>::assign((CImg<short> *)&raw,(uint)uVar10,1,1,1);
              cimg::fread<short>((short *)raw._data,raw._0_8_ & 0xffffffff,(FILE *)__stream);
              if (((char)local_ac != '\0') &&
                 (lVar9 = ((ulong)raw._8_8_ >> 0x20) * (raw._8_8_ & 0xffffffff) *
                          ((ulong)raw._0_8_ >> 0x20) * (raw._0_8_ & 0xffffffff), 0 < lVar9)) {
                pbVar11 = raw._data + lVar9 * 2;
                do {
                  pbVar12 = pbVar11 + -2;
                  *(ushort *)pbVar12 = *(ushort *)pbVar12 << 8 | *(ushort *)pbVar12 >> 8;
                  pbVar11 = pbVar11 + -2;
                } while (raw._data < pbVar11);
              }
              if ((raw._0_8_ & 0xffffffff) != 0) {
                uVar10 = 0;
                do {
                  puVar22[uVar10] = raw._data[uVar10 * 2];
                  uVar10 = uVar10 + 1;
                } while ((raw._0_8_ & 0xffffffff) != uVar10);
                puVar22 = puVar22 + uVar10;
              }
              uVar21 = uVar21 - (raw._0_8_ & 0xffffffff);
            } while (uVar21 != 0);
          }
          if ((raw._is_shared == false) && (raw._data != (bool *)0x0)) {
            operator_delete__(raw._data);
          }
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < N);
    }
  }
LAB_0013c161:
  pcVar17 = str_pixeltype._data;
  if (!bVar24) {
    sVar4 = strlen(str_pixeltype._data);
    iVar3 = (int)sVar4;
    iVar2 = 0xc;
    if (iVar3 < 0xc) {
      iVar2 = iVar3;
    }
    uVar8 = iVar2 + 1;
    if (uVar8 != 0) {
      if (iVar3 < 0) {
        bVar23 = true;
        uVar20 = 0;
      }
      else {
        iVar2 = 0xc;
        if (iVar3 < 0xc) {
          iVar2 = iVar3;
        }
        uVar20 = 0;
        do {
          cVar1 = "unsigned_int"[uVar20];
          cVar14 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar14 = cVar1;
          }
          cVar1 = pcVar17[uVar20];
          cVar15 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar15 = cVar1;
          }
          bVar23 = cVar14 == cVar15;
          if (!bVar23) goto LAB_0013c439;
          uVar20 = uVar20 + 1;
        } while (iVar2 + 1 != (int)uVar20);
        uVar20 = (ulong)uVar8;
      }
LAB_0013c439:
      if (((uint)uVar20 != uVar8) && (!bVar23)) goto LAB_0013c44a;
    }
    bVar24 = true;
    if (N != 0) {
      uVar20 = 0;
      do {
        iVar2 = fgetc(__stream);
        if (iVar2 < 0 || iVar2 == 10) {
          uVar21 = 0;
        }
        else {
          uVar10 = 0;
          do {
            uVar21 = uVar10 + 1;
            tmp._data[uVar10] = (char)iVar2;
            iVar2 = fgetc(__stream);
            if ((iVar2 == 10) || (iVar2 < 0)) break;
            bVar23 = uVar10 < 0xfe;
            uVar10 = uVar21;
          } while (bVar23);
        }
        tmp._data[uVar21] = '\0';
        C = 0;
        D = 0;
        H = 0;
        W = 0;
        csiz = 0;
        iVar2 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
        if (iVar2 < 4) {
          pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar17 = "(FILE*)";
          if (filename != (char *)0x0) {
            pcVar17 = filename;
          }
          CImgIOException::CImgIOException
                    (pCVar7,
                     "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                     ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char",
                     (ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar20,pcVar17);
          __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
        }
        if (D * C * H * W != 0) {
          raw._data = (bool *)0x0;
          raw._width = 0;
          raw._height = 0;
          raw._depth = 0;
          raw._spectrum = 0;
          raw._is_shared = false;
          if (iVar2 == 5) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            pcVar17 = "(FILE*)";
            if (filename != (char *)0x0) {
              pcVar17 = filename;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                       ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                       "unsigned char",pcVar17);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
          }
          pCVar18 = this->_data + uVar20;
          CImg<unsigned_char>::assign(pCVar18,W,H,D,C);
          uVar21 = (ulong)pCVar18->_spectrum * (ulong)pCVar18->_depth *
                   (ulong)pCVar18->_height * (ulong)pCVar18->_width;
          if (uVar21 != 0) {
            puVar22 = pCVar18->_data;
            do {
              uVar10 = 0x1800000;
              if (uVar21 < 0x1800000) {
                uVar10 = uVar21;
              }
              CImg<unsigned_int>::assign((CImg<unsigned_int> *)&raw,(uint)uVar10,1,1,1);
              cimg::fread<unsigned_int>((uint *)raw._data,raw._0_8_ & 0xffffffff,(FILE *)__stream);
              if (((char)local_ac != '\0') &&
                 (lVar9 = ((ulong)raw._8_8_ >> 0x20) * (raw._8_8_ & 0xffffffff) *
                          ((ulong)raw._0_8_ >> 0x20) * (raw._0_8_ & 0xffffffff), 0 < lVar9)) {
                pbVar11 = raw._data + lVar9 * 4;
                do {
                  uVar8 = *(uint *)(pbVar11 + -4);
                  *(uint *)(pbVar11 + -4) =
                       uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                       uVar8 << 0x18;
                  pbVar11 = pbVar11 + -4;
                } while (raw._data < pbVar11);
              }
              if ((raw._0_8_ & 0xffffffff) != 0) {
                uVar10 = 0;
                do {
                  puVar22[uVar10] = raw._data[uVar10 * 4];
                  uVar10 = uVar10 + 1;
                } while ((raw._0_8_ & 0xffffffff) != uVar10);
                puVar22 = puVar22 + uVar10;
              }
              uVar21 = uVar21 - (raw._0_8_ & 0xffffffff);
            } while (uVar21 != 0);
          }
          if ((raw._is_shared == false) && (raw._data != (bool *)0x0)) {
            operator_delete__(raw._data);
          }
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < N);
    }
  }
LAB_0013c44a:
  pcVar17 = str_pixeltype._data;
  if (!bVar24) {
    sVar4 = strlen(str_pixeltype._data);
    iVar3 = (int)sVar4;
    iVar2 = 4;
    if (iVar3 < 4) {
      iVar2 = iVar3;
    }
    uVar8 = iVar2 + 1;
    if (uVar8 != 0) {
      if (iVar3 < 0) {
        bVar23 = true;
        uVar20 = 0;
      }
      else {
        iVar2 = 4;
        if (iVar3 < 4) {
          iVar2 = iVar3;
        }
        uVar20 = 0;
        do {
          cVar1 = "uint"[uVar20];
          cVar14 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar14 = cVar1;
          }
          cVar1 = pcVar17[uVar20];
          cVar15 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar15 = cVar1;
          }
          bVar23 = cVar14 == cVar15;
          if (!bVar23) goto LAB_0013c722;
          uVar20 = uVar20 + 1;
        } while (iVar2 + 1 != (int)uVar20);
        uVar20 = (ulong)uVar8;
      }
LAB_0013c722:
      if (((uint)uVar20 != uVar8) && (!bVar23)) goto LAB_0013c733;
    }
    bVar24 = true;
    if (N != 0) {
      uVar20 = 0;
      do {
        iVar2 = fgetc(__stream);
        if (iVar2 < 0 || iVar2 == 10) {
          uVar21 = 0;
        }
        else {
          uVar10 = 0;
          do {
            uVar21 = uVar10 + 1;
            tmp._data[uVar10] = (char)iVar2;
            iVar2 = fgetc(__stream);
            if ((iVar2 == 10) || (iVar2 < 0)) break;
            bVar23 = uVar10 < 0xfe;
            uVar10 = uVar21;
          } while (bVar23);
        }
        tmp._data[uVar21] = '\0';
        C = 0;
        D = 0;
        H = 0;
        W = 0;
        csiz = 0;
        iVar2 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
        if (iVar2 < 4) {
          pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar17 = "(FILE*)";
          if (filename != (char *)0x0) {
            pcVar17 = filename;
          }
          CImgIOException::CImgIOException
                    (pCVar7,
                     "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                     ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char",
                     (ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar20,pcVar17);
          __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
        }
        if (D * C * H * W != 0) {
          raw._data = (bool *)0x0;
          raw._width = 0;
          raw._height = 0;
          raw._depth = 0;
          raw._spectrum = 0;
          raw._is_shared = false;
          if (iVar2 == 5) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            pcVar17 = "(FILE*)";
            if (filename != (char *)0x0) {
              pcVar17 = filename;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                       ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                       "unsigned char",pcVar17);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
          }
          pCVar18 = this->_data + uVar20;
          CImg<unsigned_char>::assign(pCVar18,W,H,D,C);
          uVar21 = (ulong)pCVar18->_spectrum * (ulong)pCVar18->_depth *
                   (ulong)pCVar18->_height * (ulong)pCVar18->_width;
          if (uVar21 != 0) {
            puVar22 = pCVar18->_data;
            do {
              uVar10 = 0x1800000;
              if (uVar21 < 0x1800000) {
                uVar10 = uVar21;
              }
              CImg<unsigned_int>::assign((CImg<unsigned_int> *)&raw,(uint)uVar10,1,1,1);
              cimg::fread<unsigned_int>((uint *)raw._data,raw._0_8_ & 0xffffffff,(FILE *)__stream);
              if (((char)local_ac != '\0') &&
                 (lVar9 = ((ulong)raw._8_8_ >> 0x20) * (raw._8_8_ & 0xffffffff) *
                          ((ulong)raw._0_8_ >> 0x20) * (raw._0_8_ & 0xffffffff), 0 < lVar9)) {
                pbVar11 = raw._data + lVar9 * 4;
                do {
                  uVar8 = *(uint *)(pbVar11 + -4);
                  *(uint *)(pbVar11 + -4) =
                       uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                       uVar8 << 0x18;
                  pbVar11 = pbVar11 + -4;
                } while (raw._data < pbVar11);
              }
              if ((raw._0_8_ & 0xffffffff) != 0) {
                uVar10 = 0;
                do {
                  puVar22[uVar10] = raw._data[uVar10 * 4];
                  uVar10 = uVar10 + 1;
                } while ((raw._0_8_ & 0xffffffff) != uVar10);
                puVar22 = puVar22 + uVar10;
              }
              uVar21 = uVar21 - (raw._0_8_ & 0xffffffff);
            } while (uVar21 != 0);
          }
          if ((raw._is_shared == false) && (raw._data != (bool *)0x0)) {
            operator_delete__(raw._data);
          }
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < N);
    }
  }
LAB_0013c733:
  pcVar17 = str_pixeltype._data;
  if (!bVar24) {
    sVar4 = strlen(str_pixeltype._data);
    iVar3 = (int)sVar4;
    iVar2 = 3;
    if (iVar3 < 3) {
      iVar2 = iVar3;
    }
    uVar8 = iVar2 + 1;
    if (uVar8 != 0) {
      if (iVar3 < 0) {
        bVar23 = true;
        uVar20 = 0;
      }
      else {
        iVar2 = 3;
        if (iVar3 < 3) {
          iVar2 = iVar3;
        }
        uVar20 = 0;
        do {
          cVar1 = "unsigned int"[uVar20 + 9];
          cVar14 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar14 = cVar1;
          }
          cVar1 = pcVar17[uVar20];
          cVar15 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar15 = cVar1;
          }
          bVar23 = cVar14 == cVar15;
          if (!bVar23) goto LAB_0013ca0b;
          uVar20 = uVar20 + 1;
        } while (iVar2 + 1 != (int)uVar20);
        uVar20 = (ulong)uVar8;
      }
LAB_0013ca0b:
      if (((uint)uVar20 != uVar8) && (!bVar23)) goto LAB_0013ca1c;
    }
    bVar24 = true;
    if (N != 0) {
      uVar20 = 0;
      do {
        iVar2 = fgetc(__stream);
        if (iVar2 < 0 || iVar2 == 10) {
          uVar21 = 0;
        }
        else {
          uVar10 = 0;
          do {
            uVar21 = uVar10 + 1;
            tmp._data[uVar10] = (char)iVar2;
            iVar2 = fgetc(__stream);
            if ((iVar2 == 10) || (iVar2 < 0)) break;
            bVar23 = uVar10 < 0xfe;
            uVar10 = uVar21;
          } while (bVar23);
        }
        tmp._data[uVar21] = '\0';
        C = 0;
        D = 0;
        H = 0;
        W = 0;
        csiz = 0;
        iVar2 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
        if (iVar2 < 4) {
          pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar17 = "(FILE*)";
          if (filename != (char *)0x0) {
            pcVar17 = filename;
          }
          CImgIOException::CImgIOException
                    (pCVar7,
                     "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                     ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char",
                     (ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar20,pcVar17);
          __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
        }
        if (D * C * H * W != 0) {
          raw._data = (bool *)0x0;
          raw._width = 0;
          raw._height = 0;
          raw._depth = 0;
          raw._spectrum = 0;
          raw._is_shared = false;
          if (iVar2 == 5) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            pcVar17 = "(FILE*)";
            if (filename != (char *)0x0) {
              pcVar17 = filename;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                       ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                       "unsigned char",pcVar17);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
          }
          pCVar18 = this->_data + uVar20;
          CImg<unsigned_char>::assign(pCVar18,W,H,D,C);
          uVar21 = (ulong)pCVar18->_spectrum * (ulong)pCVar18->_depth *
                   (ulong)pCVar18->_height * (ulong)pCVar18->_width;
          if (uVar21 != 0) {
            puVar22 = pCVar18->_data;
            do {
              uVar10 = 0x1800000;
              if (uVar21 < 0x1800000) {
                uVar10 = uVar21;
              }
              CImg<int>::assign((CImg<int> *)&raw,(uint)uVar10,1,1,1);
              cimg::fread<int>((int *)raw._data,raw._0_8_ & 0xffffffff,(FILE *)__stream);
              if (((char)local_ac != '\0') &&
                 (lVar9 = ((ulong)raw._8_8_ >> 0x20) * (raw._8_8_ & 0xffffffff) *
                          ((ulong)raw._0_8_ >> 0x20) * (raw._0_8_ & 0xffffffff), 0 < lVar9)) {
                pbVar11 = raw._data + lVar9 * 4;
                do {
                  uVar8 = *(uint *)(pbVar11 + -4);
                  *(uint *)(pbVar11 + -4) =
                       uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                       uVar8 << 0x18;
                  pbVar11 = pbVar11 + -4;
                } while (raw._data < pbVar11);
              }
              if ((raw._0_8_ & 0xffffffff) != 0) {
                uVar10 = 0;
                do {
                  puVar22[uVar10] = raw._data[uVar10 * 4];
                  uVar10 = uVar10 + 1;
                } while ((raw._0_8_ & 0xffffffff) != uVar10);
                puVar22 = puVar22 + uVar10;
              }
              uVar21 = uVar21 - (raw._0_8_ & 0xffffffff);
            } while (uVar21 != 0);
          }
          if ((raw._is_shared == false) && (raw._data != (bool *)0x0)) {
            operator_delete__(raw._data);
          }
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < N);
    }
  }
LAB_0013ca1c:
  pcVar17 = str_pixeltype._data;
  if (!bVar24) {
    sVar4 = strlen(str_pixeltype._data);
    iVar3 = (int)sVar4;
    iVar2 = 0xd;
    if (iVar3 < 0xd) {
      iVar2 = iVar3;
    }
    uVar8 = iVar2 + 1;
    if (uVar8 != 0) {
      if (iVar3 < 0) {
        bVar23 = true;
        uVar20 = 0;
      }
      else {
        iVar2 = 0xd;
        if (iVar3 < 0xd) {
          iVar2 = iVar3;
        }
        uVar20 = 0;
        do {
          cVar1 = "unsigned_long"[uVar20];
          cVar14 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar14 = cVar1;
          }
          cVar1 = pcVar17[uVar20];
          cVar15 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar15 = cVar1;
          }
          bVar23 = cVar14 == cVar15;
          if (!bVar23) goto LAB_0013cd0e;
          uVar20 = uVar20 + 1;
        } while (iVar2 + 1 != (int)uVar20);
        uVar20 = (ulong)uVar8;
      }
LAB_0013cd0e:
      if (((uint)uVar20 != uVar8) && (!bVar23)) goto LAB_0013cd1f;
    }
    bVar24 = true;
    if (N != 0) {
      uVar20 = 0;
      do {
        iVar2 = fgetc(__stream);
        if (iVar2 < 0 || iVar2 == 10) {
          uVar21 = 0;
        }
        else {
          uVar10 = 0;
          do {
            uVar21 = uVar10 + 1;
            tmp._data[uVar10] = (char)iVar2;
            iVar2 = fgetc(__stream);
            if ((iVar2 == 10) || (iVar2 < 0)) break;
            bVar23 = uVar10 < 0xfe;
            uVar10 = uVar21;
          } while (bVar23);
        }
        tmp._data[uVar21] = '\0';
        C = 0;
        D = 0;
        H = 0;
        W = 0;
        csiz = 0;
        iVar2 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
        if (iVar2 < 4) {
          pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar17 = "(FILE*)";
          if (filename != (char *)0x0) {
            pcVar17 = filename;
          }
          CImgIOException::CImgIOException
                    (pCVar7,
                     "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                     ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char",
                     (ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar20,pcVar17);
          __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
        }
        if (D * C * H * W != 0) {
          raw._data = (bool *)0x0;
          raw._width = 0;
          raw._height = 0;
          raw._depth = 0;
          raw._spectrum = 0;
          raw._is_shared = false;
          if (iVar2 == 5) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            pcVar17 = "(FILE*)";
            if (filename != (char *)0x0) {
              pcVar17 = filename;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                       ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                       "unsigned char",pcVar17);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
          }
          pCVar18 = this->_data + uVar20;
          CImg<unsigned_char>::assign(pCVar18,W,H,D,C);
          uVar21 = (ulong)pCVar18->_spectrum * (ulong)pCVar18->_depth *
                   (ulong)pCVar18->_height * (ulong)pCVar18->_width;
          if (uVar21 != 0) {
            puVar22 = pCVar18->_data;
            do {
              uVar10 = 0x1800000;
              if (uVar21 < 0x1800000) {
                uVar10 = uVar21;
              }
              CImg<unsigned_long>::assign((CImg<unsigned_long> *)&raw,(uint)uVar10,1,1,1);
              cimg::fread<unsigned_long>
                        ((unsigned_long *)raw._data,raw._0_8_ & 0xffffffff,(FILE *)__stream);
              if (((char)local_ac != '\0') &&
                 (lVar9 = ((ulong)raw._8_8_ >> 0x20) * (raw._8_8_ & 0xffffffff) *
                          ((ulong)raw._0_8_ >> 0x20) * (raw._0_8_ & 0xffffffff), 0 < lVar9)) {
                pbVar12 = raw._data + lVar9 * 8 + -1;
                pbVar11 = raw._data + lVar9 * 8;
                do {
                  pbVar13 = pbVar11 + -8;
                  lVar9 = -8;
                  pbVar16 = pbVar12;
                  do {
                    bVar23 = pbVar11[lVar9];
                    pbVar11[lVar9] = *pbVar16;
                    *pbVar16 = bVar23;
                    lVar9 = lVar9 + 1;
                    pbVar16 = pbVar16 + -1;
                  } while ((int)lVar9 != -4);
                  pbVar12 = pbVar12 + -8;
                  pbVar11 = pbVar13;
                } while (raw._data < pbVar13);
              }
              if ((raw._0_8_ & 0xffffffff) != 0) {
                uVar10 = 0;
                do {
                  puVar22[uVar10] = raw._data[uVar10 * 8];
                  uVar10 = uVar10 + 1;
                } while ((raw._0_8_ & 0xffffffff) != uVar10);
                puVar22 = puVar22 + uVar10;
              }
              uVar21 = uVar21 - (raw._0_8_ & 0xffffffff);
            } while (uVar21 != 0);
          }
          if ((raw._is_shared == false) && (raw._data != (bool *)0x0)) {
            operator_delete__(raw._data);
          }
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < N);
    }
  }
LAB_0013cd1f:
  pcVar17 = str_pixeltype._data;
  if (!bVar24) {
    sVar4 = strlen(str_pixeltype._data);
    iVar3 = (int)sVar4;
    iVar2 = 5;
    if (iVar3 < 5) {
      iVar2 = iVar3;
    }
    uVar8 = iVar2 + 1;
    if (uVar8 != 0) {
      if (iVar3 < 0) {
        bVar23 = true;
        uVar20 = 0;
      }
      else {
        iVar2 = 5;
        if (iVar3 < 5) {
          iVar2 = iVar3;
        }
        uVar20 = 0;
        do {
          cVar1 = "ulong"[uVar20];
          cVar14 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar14 = cVar1;
          }
          cVar1 = pcVar17[uVar20];
          cVar15 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar15 = cVar1;
          }
          bVar23 = cVar14 == cVar15;
          if (!bVar23) goto LAB_0013d011;
          uVar20 = uVar20 + 1;
        } while (iVar2 + 1 != (int)uVar20);
        uVar20 = (ulong)uVar8;
      }
LAB_0013d011:
      if (((uint)uVar20 != uVar8) && (!bVar23)) goto LAB_0013d022;
    }
    bVar24 = true;
    if (N != 0) {
      uVar20 = 0;
      do {
        iVar2 = fgetc(__stream);
        if (iVar2 < 0 || iVar2 == 10) {
          uVar21 = 0;
        }
        else {
          uVar10 = 0;
          do {
            uVar21 = uVar10 + 1;
            tmp._data[uVar10] = (char)iVar2;
            iVar2 = fgetc(__stream);
            if ((iVar2 == 10) || (iVar2 < 0)) break;
            bVar23 = uVar10 < 0xfe;
            uVar10 = uVar21;
          } while (bVar23);
        }
        tmp._data[uVar21] = '\0';
        C = 0;
        D = 0;
        H = 0;
        W = 0;
        csiz = 0;
        iVar2 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
        if (iVar2 < 4) {
          pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar17 = "(FILE*)";
          if (filename != (char *)0x0) {
            pcVar17 = filename;
          }
          CImgIOException::CImgIOException
                    (pCVar7,
                     "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                     ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char",
                     (ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar20,pcVar17);
          __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
        }
        if (D * C * H * W != 0) {
          raw._data = (bool *)0x0;
          raw._width = 0;
          raw._height = 0;
          raw._depth = 0;
          raw._spectrum = 0;
          raw._is_shared = false;
          if (iVar2 == 5) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            pcVar17 = "(FILE*)";
            if (filename != (char *)0x0) {
              pcVar17 = filename;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                       ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                       "unsigned char",pcVar17);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
          }
          pCVar18 = this->_data + uVar20;
          CImg<unsigned_char>::assign(pCVar18,W,H,D,C);
          uVar21 = (ulong)pCVar18->_spectrum * (ulong)pCVar18->_depth *
                   (ulong)pCVar18->_height * (ulong)pCVar18->_width;
          if (uVar21 != 0) {
            puVar22 = pCVar18->_data;
            do {
              uVar10 = 0x1800000;
              if (uVar21 < 0x1800000) {
                uVar10 = uVar21;
              }
              CImg<unsigned_long>::assign((CImg<unsigned_long> *)&raw,(uint)uVar10,1,1,1);
              cimg::fread<unsigned_long>
                        ((unsigned_long *)raw._data,raw._0_8_ & 0xffffffff,(FILE *)__stream);
              if (((char)local_ac != '\0') &&
                 (lVar9 = ((ulong)raw._8_8_ >> 0x20) * (raw._8_8_ & 0xffffffff) *
                          ((ulong)raw._0_8_ >> 0x20) * (raw._0_8_ & 0xffffffff), 0 < lVar9)) {
                pbVar12 = raw._data + lVar9 * 8 + -1;
                pbVar11 = raw._data + lVar9 * 8;
                do {
                  pbVar13 = pbVar11 + -8;
                  lVar9 = -8;
                  pbVar16 = pbVar12;
                  do {
                    bVar23 = pbVar11[lVar9];
                    pbVar11[lVar9] = *pbVar16;
                    *pbVar16 = bVar23;
                    lVar9 = lVar9 + 1;
                    pbVar16 = pbVar16 + -1;
                  } while ((int)lVar9 != -4);
                  pbVar12 = pbVar12 + -8;
                  pbVar11 = pbVar13;
                } while (raw._data < pbVar13);
              }
              if ((raw._0_8_ & 0xffffffff) != 0) {
                uVar10 = 0;
                do {
                  puVar22[uVar10] = raw._data[uVar10 * 8];
                  uVar10 = uVar10 + 1;
                } while ((raw._0_8_ & 0xffffffff) != uVar10);
                puVar22 = puVar22 + uVar10;
              }
              uVar21 = uVar21 - (raw._0_8_ & 0xffffffff);
            } while (uVar21 != 0);
          }
          if ((raw._is_shared == false) && (raw._data != (bool *)0x0)) {
            operator_delete__(raw._data);
          }
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < N);
    }
  }
LAB_0013d022:
  pcVar17 = str_pixeltype._data;
  if (!bVar24) {
    sVar4 = strlen(str_pixeltype._data);
    iVar3 = (int)sVar4;
    iVar2 = 4;
    if (iVar3 < 4) {
      iVar2 = iVar3;
    }
    uVar8 = iVar2 + 1;
    if (uVar8 != 0) {
      if (iVar3 < 0) {
        bVar23 = true;
        uVar20 = 0;
      }
      else {
        iVar2 = 4;
        if (iVar3 < 4) {
          iVar2 = iVar3;
        }
        uVar20 = 0;
        do {
          cVar1 = "unsigned long"[uVar20 + 9];
          cVar14 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar14 = cVar1;
          }
          cVar1 = pcVar17[uVar20];
          cVar15 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar15 = cVar1;
          }
          bVar23 = cVar14 == cVar15;
          if (!bVar23) goto LAB_0013d314;
          uVar20 = uVar20 + 1;
        } while (iVar2 + 1 != (int)uVar20);
        uVar20 = (ulong)uVar8;
      }
LAB_0013d314:
      if (((uint)uVar20 != uVar8) && (!bVar23)) goto LAB_0013d325;
    }
    bVar24 = true;
    if (N != 0) {
      uVar20 = 0;
      do {
        iVar2 = fgetc(__stream);
        if (iVar2 < 0 || iVar2 == 10) {
          uVar21 = 0;
        }
        else {
          uVar10 = 0;
          do {
            uVar21 = uVar10 + 1;
            tmp._data[uVar10] = (char)iVar2;
            iVar2 = fgetc(__stream);
            if ((iVar2 == 10) || (iVar2 < 0)) break;
            bVar23 = uVar10 < 0xfe;
            uVar10 = uVar21;
          } while (bVar23);
        }
        tmp._data[uVar21] = '\0';
        C = 0;
        D = 0;
        H = 0;
        W = 0;
        csiz = 0;
        iVar2 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
        if (iVar2 < 4) {
          pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar17 = "(FILE*)";
          if (filename != (char *)0x0) {
            pcVar17 = filename;
          }
          CImgIOException::CImgIOException
                    (pCVar7,
                     "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                     ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char",
                     (ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar20,pcVar17);
          __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
        }
        if (D * C * H * W != 0) {
          raw._data = (bool *)0x0;
          raw._width = 0;
          raw._height = 0;
          raw._depth = 0;
          raw._spectrum = 0;
          raw._is_shared = false;
          if (iVar2 == 5) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            pcVar17 = "(FILE*)";
            if (filename != (char *)0x0) {
              pcVar17 = filename;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                       ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                       "unsigned char",pcVar17);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
          }
          pCVar18 = this->_data + uVar20;
          CImg<unsigned_char>::assign(pCVar18,W,H,D,C);
          uVar21 = (ulong)pCVar18->_spectrum * (ulong)pCVar18->_depth *
                   (ulong)pCVar18->_height * (ulong)pCVar18->_width;
          if (uVar21 != 0) {
            puVar22 = pCVar18->_data;
            do {
              uVar10 = 0x1800000;
              if (uVar21 < 0x1800000) {
                uVar10 = uVar21;
              }
              CImg<long>::assign((CImg<long> *)&raw,(uint)uVar10,1,1,1);
              cimg::fread<long>((long *)raw._data,raw._0_8_ & 0xffffffff,(FILE *)__stream);
              if (((char)local_ac != '\0') &&
                 (lVar9 = ((ulong)raw._8_8_ >> 0x20) * (raw._8_8_ & 0xffffffff) *
                          ((ulong)raw._0_8_ >> 0x20) * (raw._0_8_ & 0xffffffff), 0 < lVar9)) {
                pbVar12 = raw._data + lVar9 * 8 + -1;
                pbVar11 = raw._data + lVar9 * 8;
                do {
                  pbVar13 = pbVar11 + -8;
                  lVar9 = -8;
                  pbVar16 = pbVar12;
                  do {
                    bVar23 = pbVar11[lVar9];
                    pbVar11[lVar9] = *pbVar16;
                    *pbVar16 = bVar23;
                    lVar9 = lVar9 + 1;
                    pbVar16 = pbVar16 + -1;
                  } while ((int)lVar9 != -4);
                  pbVar12 = pbVar12 + -8;
                  pbVar11 = pbVar13;
                } while (raw._data < pbVar13);
              }
              if ((raw._0_8_ & 0xffffffff) != 0) {
                uVar10 = 0;
                do {
                  puVar22[uVar10] = raw._data[uVar10 * 8];
                  uVar10 = uVar10 + 1;
                } while ((raw._0_8_ & 0xffffffff) != uVar10);
                puVar22 = puVar22 + uVar10;
              }
              uVar21 = uVar21 - (raw._0_8_ & 0xffffffff);
            } while (uVar21 != 0);
          }
          if ((raw._is_shared == false) && (raw._data != (bool *)0x0)) {
            operator_delete__(raw._data);
          }
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < N);
    }
  }
LAB_0013d325:
  pcVar17 = str_pixeltype._data;
  if (!bVar24) {
    sVar4 = strlen(str_pixeltype._data);
    iVar3 = (int)sVar4;
    iVar2 = 5;
    if (iVar3 < 5) {
      iVar2 = iVar3;
    }
    uVar8 = iVar2 + 1;
    if (uVar8 != 0) {
      if (iVar3 < 0) {
        bVar23 = true;
        uVar20 = 0;
      }
      else {
        iVar2 = 5;
        if (iVar3 < 5) {
          iVar2 = iVar3;
        }
        uVar20 = 0;
        do {
          cVar1 = "float"[uVar20];
          cVar14 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar14 = cVar1;
          }
          cVar1 = pcVar17[uVar20];
          cVar15 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar15 = cVar1;
          }
          bVar23 = cVar14 == cVar15;
          if (!bVar23) goto LAB_0013d5fe;
          uVar20 = uVar20 + 1;
        } while (iVar2 + 1 != (int)uVar20);
        uVar20 = (ulong)uVar8;
      }
LAB_0013d5fe:
      if (((uint)uVar20 != uVar8) && (!bVar23)) goto LAB_0013d60f;
    }
    bVar24 = true;
    if (N != 0) {
      uVar20 = 0;
      do {
        iVar2 = fgetc(__stream);
        if (iVar2 < 0 || iVar2 == 10) {
          uVar21 = 0;
        }
        else {
          uVar10 = 0;
          do {
            uVar21 = uVar10 + 1;
            tmp._data[uVar10] = (char)iVar2;
            iVar2 = fgetc(__stream);
            if ((iVar2 == 10) || (iVar2 < 0)) break;
            bVar23 = uVar10 < 0xfe;
            uVar10 = uVar21;
          } while (bVar23);
        }
        tmp._data[uVar21] = '\0';
        C = 0;
        D = 0;
        H = 0;
        W = 0;
        csiz = 0;
        iVar2 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
        if (iVar2 < 4) {
          pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar17 = "(FILE*)";
          if (filename != (char *)0x0) {
            pcVar17 = filename;
          }
          CImgIOException::CImgIOException
                    (pCVar7,
                     "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                     ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char",
                     (ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar20,pcVar17);
          __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
        }
        if (D * C * H * W != 0) {
          raw._data = (bool *)0x0;
          raw._width = 0;
          raw._height = 0;
          raw._depth = 0;
          raw._spectrum = 0;
          raw._is_shared = false;
          if (iVar2 == 5) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            pcVar17 = "(FILE*)";
            if (filename != (char *)0x0) {
              pcVar17 = filename;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                       ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                       "unsigned char",pcVar17);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
          }
          pCVar18 = this->_data + uVar20;
          CImg<unsigned_char>::assign(pCVar18,W,H,D,C);
          uVar21 = (ulong)pCVar18->_spectrum * (ulong)pCVar18->_depth *
                   (ulong)pCVar18->_height * (ulong)pCVar18->_width;
          if (uVar21 != 0) {
            puVar22 = pCVar18->_data;
            do {
              uVar10 = 0x1800000;
              if (uVar21 < 0x1800000) {
                uVar10 = uVar21;
              }
              CImg<float>::assign((CImg<float> *)&raw,(uint)uVar10,1,1,1);
              cimg::fread<float>((float *)raw._data,raw._0_8_ & 0xffffffff,(FILE *)__stream);
              if (((char)local_ac != '\0') &&
                 (lVar9 = ((ulong)raw._8_8_ >> 0x20) * (raw._8_8_ & 0xffffffff) *
                          ((ulong)raw._0_8_ >> 0x20) * (raw._0_8_ & 0xffffffff), 0 < lVar9)) {
                pbVar11 = raw._data + lVar9 * 4;
                do {
                  uVar8 = *(uint *)(pbVar11 + -4);
                  *(uint *)(pbVar11 + -4) =
                       uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                       uVar8 << 0x18;
                  pbVar11 = pbVar11 + -4;
                } while (raw._data < pbVar11);
              }
              if ((raw._0_8_ & 0xffffffff) != 0) {
                uVar10 = 0;
                do {
                  puVar22[uVar10] = (uchar)(int)*(float *)(raw._data + uVar10 * 4);
                  uVar10 = uVar10 + 1;
                } while ((raw._0_8_ & 0xffffffff) != uVar10);
                puVar22 = puVar22 + uVar10;
              }
              uVar21 = uVar21 - (raw._0_8_ & 0xffffffff);
            } while (uVar21 != 0);
          }
          if ((raw._is_shared == false) && (raw._data != (bool *)0x0)) {
            operator_delete__(raw._data);
          }
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < N);
    }
  }
LAB_0013d60f:
  pcVar17 = str_pixeltype._data;
  if (!bVar24) {
    sVar4 = strlen(str_pixeltype._data);
    iVar3 = (int)sVar4;
    iVar2 = 6;
    if (iVar3 < 6) {
      iVar2 = iVar3;
    }
    uVar8 = iVar2 + 1;
    if (uVar8 != 0) {
      if (iVar3 < 0) {
        bVar23 = true;
        uVar20 = 0;
      }
      else {
        iVar2 = 6;
        if (iVar3 < 6) {
          iVar2 = iVar3;
        }
        uVar20 = 0;
        do {
          cVar1 = "double"[uVar20];
          cVar14 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar14 = cVar1;
          }
          cVar1 = pcVar17[uVar20];
          cVar15 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar15 = cVar1;
          }
          bVar23 = cVar14 == cVar15;
          if (!bVar23) goto LAB_0013d902;
          uVar20 = uVar20 + 1;
        } while (iVar2 + 1 != (int)uVar20);
        uVar20 = (ulong)uVar8;
      }
LAB_0013d902:
      if (((uint)uVar20 != uVar8) && (!bVar23)) goto LAB_0013d913;
    }
    bVar24 = true;
    if (N != 0) {
      uVar20 = 0;
      do {
        iVar2 = fgetc(__stream);
        if (iVar2 < 0 || iVar2 == 10) {
          uVar21 = 0;
        }
        else {
          uVar10 = 0;
          do {
            uVar21 = uVar10 + 1;
            tmp._data[uVar10] = (char)iVar2;
            iVar2 = fgetc(__stream);
            if ((iVar2 == 10) || (iVar2 < 0)) break;
            bVar23 = uVar10 < 0xfe;
            uVar10 = uVar21;
          } while (bVar23);
        }
        tmp._data[uVar21] = '\0';
        C = 0;
        D = 0;
        H = 0;
        W = 0;
        csiz = 0;
        iVar2 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
        if (iVar2 < 4) {
          pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar17 = "(FILE*)";
          if (filename != (char *)0x0) {
            pcVar17 = filename;
          }
          CImgIOException::CImgIOException
                    (pCVar7,
                     "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                     ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char",
                     (ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar20,pcVar17);
          __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
        }
        if (D * C * H * W != 0) {
          raw._data = (bool *)0x0;
          raw._width = 0;
          raw._height = 0;
          raw._depth = 0;
          raw._spectrum = 0;
          raw._is_shared = false;
          if (iVar2 == 5) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            pcVar17 = "(FILE*)";
            if (filename != (char *)0x0) {
              pcVar17 = filename;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                       ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                       "unsigned char",pcVar17);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
          }
          pCVar18 = this->_data + uVar20;
          CImg<unsigned_char>::assign(pCVar18,W,H,D,C);
          uVar21 = (ulong)pCVar18->_spectrum * (ulong)pCVar18->_depth *
                   (ulong)pCVar18->_height * (ulong)pCVar18->_width;
          if (uVar21 != 0) {
            puVar22 = pCVar18->_data;
            do {
              uVar10 = 0x1800000;
              if (uVar21 < 0x1800000) {
                uVar10 = uVar21;
              }
              CImg<double>::assign((CImg<double> *)&raw,(uint)uVar10,1,1,1);
              cimg::fread<double>((double *)raw._data,raw._0_8_ & 0xffffffff,(FILE *)__stream);
              if (((char)local_ac != '\0') &&
                 (lVar9 = ((ulong)raw._8_8_ >> 0x20) * (raw._8_8_ & 0xffffffff) *
                          ((ulong)raw._0_8_ >> 0x20) * (raw._0_8_ & 0xffffffff), 0 < lVar9)) {
                pbVar12 = raw._data + lVar9 * 8 + -1;
                pbVar11 = raw._data + lVar9 * 8;
                do {
                  pbVar13 = pbVar11 + -8;
                  lVar9 = -8;
                  pbVar16 = pbVar12;
                  do {
                    bVar23 = pbVar11[lVar9];
                    pbVar11[lVar9] = *pbVar16;
                    *pbVar16 = bVar23;
                    lVar9 = lVar9 + 1;
                    pbVar16 = pbVar16 + -1;
                  } while ((int)lVar9 != -4);
                  pbVar12 = pbVar12 + -8;
                  pbVar11 = pbVar13;
                } while (raw._data < pbVar13);
              }
              if ((raw._0_8_ & 0xffffffff) != 0) {
                uVar10 = 0;
                do {
                  puVar22[uVar10] = (uchar)(int)*(double *)(raw._data + uVar10 * 8);
                  uVar10 = uVar10 + 1;
                } while ((raw._0_8_ & 0xffffffff) != uVar10);
                puVar22 = puVar22 + uVar10;
              }
              uVar21 = uVar21 - (raw._0_8_ & 0xffffffff);
            } while (uVar21 != 0);
          }
          if ((raw._is_shared == false) && (raw._data != (bool *)0x0)) {
            operator_delete__(raw._data);
          }
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < N);
    }
  }
LAB_0013d913:
  if (bVar24) {
    if (file == (FILE *)0x0) {
      if (__stream == (FILE *)0x0) {
        cimg::warn("cimg::fclose(): Specified file is (null).");
      }
      else if (((_stdin != __stream) && (_stdout != __stream)) &&
              (uVar8 = fclose(__stream), uVar8 != 0)) {
        cimg::warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar8);
      }
    }
    if ((str_endian._is_shared == false) && (str_endian._data != (char *)0x0)) {
      operator_delete__(str_endian._data);
    }
    if ((str_pixeltype._is_shared == false) && (str_pixeltype._data != (char *)0x0)) {
      operator_delete__(str_pixeltype._data);
    }
    if ((tmp._is_shared == false) && (tmp._data != (char *)0x0)) {
      operator_delete__(tmp._data);
    }
    return this;
  }
  if (file == (FILE *)0x0) {
    cimg::fclose(__stream);
  }
  pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
  pcVar17 = "(FILE*)";
  if (filename != (char *)0x0) {
    pcVar17 = filename;
  }
  CImgIOException::CImgIOException
            (pCVar7,
             "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unsupported pixel type \'%s\' for file \'%s\'."
             ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char",
             str_pixeltype._data,pcVar17);
LAB_0013ea83:
  __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
}

Assistant:

CImgList<T>& _load_cimg(std::FILE *const file, const char *const filename) {
#ifdef cimg_use_zlib
#define _cimgz_load_cimg_case(Tss) { \
   Bytef *const cbuf = new Bytef[csiz]; \
   cimg::fread(cbuf,csiz,nfile); \
   raw.assign(W,H,D,C); \
   unsigned long destlen = (unsigned long)raw.size()*sizeof(Tss); \
   uncompress((Bytef*)raw._data,&destlen,cbuf,csiz); \
   delete[] cbuf; \
   if (endian!=cimg::endianness()) cimg::invert_endianness(raw._data,raw.size()); \
   raw.move_to(img); \
}
#else
#define _cimgz_load_cimg_case(Tss) \
   throw CImgIOException(_cimglist_instance \
                         "load_cimg(): Unable to load compressed data from file '%s' unless zlib is enabled.", \
                         cimglist_instance, \
                         filename?filename:"(FILE*)");
#endif

#define _cimg_load_cimg_case(Ts,Tss) \
      if (!loaded && !cimg::strcasecmp(Ts,str_pixeltype)) { \
        for (unsigned int l = 0; l<N; ++l) { \
          j = 0; while ((i=std::fgetc(nfile))!='\n' && i>=0 && j<255) tmp[j++] = (char)i; tmp[j] = 0; \
          W = H = D = C = 0; csiz = 0; \
          if ((err = cimg_sscanf(tmp,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz))<4) \
            throw CImgIOException(_cimglist_instance \
                                  "load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file '%s'.", \
                                  cimglist_instance, \
                                  W,H,D,C,l,filename?filename:("(FILE*)")); \
          if (W*H*D*C>0) { \
            CImg<Tss> raw; \
            CImg<T> &img = _data[l]; \
            if (err==5) _cimgz_load_cimg_case(Tss) \
            else { \
              img.assign(W,H,D,C); \
              T *ptrd = img._data; \
              for (unsigned long to_read = img.size(); to_read; ) { \
                raw.assign(cimg::min(to_read,cimg_iobuffer)); \
                cimg::fread(raw._data,raw._width,nfile); \
                if (endian!=cimg::endianness()) cimg::invert_endianness(raw._data,raw.size()); \
                const Tss *ptrs = raw._data; \
                for (unsigned long off = (unsigned long)raw._width; off; --off) *(ptrd++) = (T)*(ptrs++); \
                to_read-=raw._width; \
              } \
            } \
          } \
        } \
        loaded = true; \
      }

      if (!filename && !file)
        throw CImgArgumentException(_cimglist_instance
                                    "load_cimg(): Specified filename is (null).",
                                    cimglist_instance);

      const unsigned long cimg_iobuffer = 24*1024*1024;
      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      bool loaded = false, endian = cimg::endianness();
      CImg<charT> tmp(256), str_pixeltype(256), str_endian(256);
      *tmp = *str_pixeltype = *str_endian = 0;
      unsigned int j, N = 0, W, H, D, C;
      unsigned long csiz;
      int i, err;
      do {
        j = 0; while ((i=std::fgetc(nfile))!='\n' && i>=0 && j<255) tmp[j++] = (char)i; tmp[j] = 0;
      } while (*tmp=='#' && i>=0);
      err = cimg_sscanf(tmp,"%u%*c%255[A-Za-z_]%*c%255[sA-Za-z_ ]",
                        &N,str_pixeltype._data,str_endian._data);
      if (err<2) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimglist_instance
                              "load_cimg(): CImg header not found in file '%s'.",
                              cimglist_instance,
                              filename?filename:"(FILE*)");
      }
      if (!cimg::strncasecmp("little",str_endian,6)) endian = false;
      else if (!cimg::strncasecmp("big",str_endian,3)) endian = true;
      assign(N);
      _cimg_load_cimg_case("bool",bool);
      _cimg_load_cimg_case("unsigned_char",unsigned char);
      _cimg_load_cimg_case("uchar",unsigned char);
      _cimg_load_cimg_case("char",char);
      _cimg_load_cimg_case("unsigned_short",unsigned short);
      _cimg_load_cimg_case("ushort",unsigned short);
      _cimg_load_cimg_case("short",short);
      _cimg_load_cimg_case("unsigned_int",unsigned int);
      _cimg_load_cimg_case("uint",unsigned int);
      _cimg_load_cimg_case("int",int);
      _cimg_load_cimg_case("unsigned_long",unsigned long);
      _cimg_load_cimg_case("ulong",unsigned long);
      _cimg_load_cimg_case("long",long);
      _cimg_load_cimg_case("float",float);
      _cimg_load_cimg_case("double",double);

      if (!loaded) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimglist_instance
                              "load_cimg(): Unsupported pixel type '%s' for file '%s'.",
                              cimglist_instance,
                              str_pixeltype._data,filename?filename:"(FILE*)");
      }
      if (!file) cimg::fclose(nfile);
      return *this;
    }